

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_b3cdf::ParserImpl::ParseBlock(ParserImpl *this)

{
  TokenDetail *detail;
  TokenDetail *t;
  int iVar1;
  int iVar2;
  long *plVar3;
  String *pSVar4;
  char *pcVar5;
  undefined8 uVar6;
  TokenDetail op;
  TokenDetail op_00;
  TokenDetail op_01;
  TokenDetail op_02;
  TokenDetail op_03;
  TokenDetail op_04;
  undefined4 uVar7;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar8;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar9;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar10;
  anon_union_8_2_010d16d7_for_TokenDetail_0 *paVar11;
  TokenDetail *pTVar12;
  GCObject *pGVar13;
  undefined8 *puVar14;
  ParseException *pPVar15;
  ParserImpl *in_RSI;
  iterator __position;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> statement;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp1;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp_list;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> block_2;
  PrefixExpType type;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> block;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp2;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_190;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_188;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_180;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_178;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_170;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_160;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_130;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_100;
  String *local_f8;
  long *local_f0;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [32];
  _func_int **local_a8;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_a0;
  String *local_98;
  _func_int **local_90;
  _func_int **local_88;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_80;
  String *local_78;
  _func_int **local_70;
  _func_int **local_68;
  _func_int **local_60;
  _func_int **local_58;
  _func_int **local_50;
  _func_int **local_48;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_40;
  vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
  *local_38;
  
  local_40._M_head_impl = (SyntaxTree *)this;
  local_c8._8_8_ = operator_new(0x28);
  (((String *)local_c8._8_8_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__Block_00188dc8;
  (((String *)local_c8._8_8_)->super_GCObject).next_ = (GCObject *)0x0;
  *(undefined8 *)&(((String *)local_c8._8_8_)->super_GCObject).field_0x10 = 0;
  (((String *)local_c8._8_8_)->field_1).str_ = (char *)0x0;
  *(undefined8 *)((long)&((String *)local_c8._8_8_)->field_1 + 8) = 0;
  local_c8._24_8_ = &PTR__ReturnStatement_00188e08;
  local_80.number_ = (double)&PTR__VarList_001891c8;
  local_88 = (_func_int **)&PTR__AssignmentStatement_00189188;
  local_48 = (_func_int **)&PTR__SyntaxTree_00188e48;
  local_58 = (_func_int **)&PTR__DoStatement_00188e88;
  local_a8 = (_func_int **)&PTR__NumericForStatement_00189008;
  local_a0.number_ = (double)&PTR__GenericForStatement_00189048;
  local_50 = (_func_int **)&PTR__FunctionName_001890c8;
  local_78 = (String *)&PTR__FunctionStatement_00189088;
  local_68 = (_func_int **)&PTR__IfStatement_00188f48;
  local_98 = (String *)&PTR__LocalFunctionStatement_00189108;
  local_90 = (_func_int **)&PTR__LocalNameListStatement_00189148;
  local_60 = (_func_int **)&PTR__RepeatStatement_00188f08;
  local_70 = (_func_int **)&PTR__WhileStatement_00188ec8;
  local_38 = (vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
              *)&(((String *)local_c8._8_8_)->super_GCObject).next_;
  detail = &in_RSI->look_ahead_;
  t = &in_RSI->current_;
  local_c8._16_8_ = (String *)0x0;
  do {
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
    }
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
LAB_00150166:
      (local_40._M_head_impl)->_vptr_SyntaxTree = (_func_int **)local_c8._8_8_;
      return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
             (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
             local_40._M_head_impl;
    }
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
    }
    if ((in_RSI->look_ahead_).token_ == 0x105) goto LAB_00150166;
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
    }
    if ((in_RSI->look_ahead_).token_ == 0x113) goto LAB_00150166;
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
    }
    if ((in_RSI->look_ahead_).token_ == 0x104) goto LAB_00150166;
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
    }
    if ((in_RSI->look_ahead_).token_ == 0x103) goto LAB_00150166;
    if ((local_c8._16_8_ & 1) != 0) {
      pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException
                (pPVar15,"unexpect statement after return statement",detail);
      __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,detail);
    }
    if ((in_RSI->look_ahead_).token_ == 0x110) {
      NextToken(in_RSI);
      if ((in_RSI->current_).token_ != 0x110) {
        __assert_fail("current_.token_ == Token_Return",
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0xe0,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseReturnStatement()"
                     );
      }
      puVar14 = (undefined8 *)operator_new(0x18);
      iVar1 = (in_RSI->current_).line_;
      *puVar14 = local_c8._24_8_;
      puVar14[1] = 0;
      *(int *)(puVar14 + 2) = iVar1;
      *(undefined4 *)((long)puVar14 + 0x14) = 0;
      if ((in_RSI->look_ahead_).token_ == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,detail);
      }
      if ((in_RSI->look_ahead_).token_ != 0x11e) {
        if ((in_RSI->look_ahead_).token_ == 0x11e) {
          luna::Lexer::GetToken(in_RSI->lexer_,detail);
        }
        if ((in_RSI->look_ahead_).token_ != 0x105) {
          if ((in_RSI->look_ahead_).token_ == 0x11e) {
            luna::Lexer::GetToken(in_RSI->lexer_,detail);
          }
          if ((in_RSI->look_ahead_).token_ != 0x113) {
            if ((in_RSI->look_ahead_).token_ == 0x11e) {
              luna::Lexer::GetToken(in_RSI->lexer_,detail);
            }
            if ((in_RSI->look_ahead_).token_ != 0x104) {
              if ((in_RSI->look_ahead_).token_ == 0x11e) {
                luna::Lexer::GetToken(in_RSI->lexer_,detail);
              }
              if ((in_RSI->look_ahead_).token_ != 0x103) {
                if ((in_RSI->look_ahead_).token_ == 0x11e) {
                  luna::Lexer::GetToken(in_RSI->lexer_,detail);
                }
                if ((in_RSI->look_ahead_).token_ != 0x3b) {
                  ParseExpList((ParserImpl *)&local_188);
                  aVar10 = local_188;
                  local_188.number_ = 0.0;
                  plVar3 = (long *)puVar14[1];
                  *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)(puVar14 + 1) = aVar10;
                  if (plVar3 != (long *)0x0) {
                    (**(code **)(*plVar3 + 8))();
                  }
                }
                if ((in_RSI->look_ahead_).token_ == 0x11e) {
                  luna::Lexer::GetToken(in_RSI->lexer_,detail);
                }
                if ((in_RSI->look_ahead_).token_ == 0x3b) {
                  NextToken(in_RSI);
                }
              }
            }
          }
        }
      }
      aVar10 = (anon_union_8_2_010d16d7_for_TokenDetail_0)
               ((anon_union_8_2_010d16d7_for_TokenDetail_0 *)((long)(local_c8._8_8_ + 0x18) + 8))->
               str_;
      *(undefined8 **)((long)(local_c8._8_8_ + 0x18) + 8) = puVar14;
      local_c8._16_8_ = CONCAT71(SUB87(local_c8._8_8_,1),1);
    }
    else {
      if ((in_RSI->look_ahead_).token_ == 0x11e) {
        luna::Lexer::GetToken(in_RSI->lexer_,detail);
      }
      iVar1 = (in_RSI->look_ahead_).token_;
      switch(iVar1) {
      case 0x101:
        aVar10.str_ = (String *)operator_new(0x30);
        pTVar12 = NextToken(in_RSI);
        ((aVar10.str_)->super_GCObject)._vptr_GCObject = local_48;
        pSVar4 = pTVar12->module_;
        pcVar5 = *(char **)&pTVar12->line_;
        uVar6 = *(undefined8 *)&pTVar12->token_;
        ((aVar10.str_)->super_GCObject).next_ = (GCObject *)pTVar12->field_0;
        *(String **)&((aVar10.str_)->super_GCObject).field_0x10 = pSVar4;
        ((aVar10.str_)->field_1).str_ = pcVar5;
        *(undefined8 *)((long)&(aVar10.str_)->field_1 + 8) = uVar6;
        *(undefined8 *)&(aVar10.str_)->length_ = 0;
        local_190.str_ = aVar10.str_;
        break;
      case 0x102:
        NextToken(in_RSI);
        if ((in_RSI->current_).token_ != 0x102) {
          __assert_fail("current_.token_ == Token_Do",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x11c,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseDoStatement()"
                       );
        }
        ParseBlock((ParserImpl *)&local_188);
        pTVar12 = NextToken(in_RSI);
        if (pTVar12->token_ != 0x105) {
          pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar15,"expect \'end\' for do-statement",t);
          __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        local_190.str_ = (String *)operator_new(0x10);
        aVar10 = local_188;
        local_188.number_ = 0.0;
        ((local_190.str_)->super_GCObject)._vptr_GCObject = local_58;
        ((local_190.str_)->super_GCObject).next_ = (GCObject *)aVar10;
        break;
      case 0x103:
      case 0x104:
      case 0x105:
      case 0x106:
      case 0x10a:
      case 0x10c:
      case 0x10d:
      case 0x10e:
      case 0x110:
      case 0x111:
      case 0x112:
      case 0x113:
switchD_0014f34e_caseD_103:
        if ((in_RSI->look_ahead_).token_ == 0x11e) {
          luna::Lexer::GetToken(in_RSI->lexer_,detail);
        }
        iVar1 = (in_RSI->look_ahead_).line_;
        ParsePrefixExp((ParserImpl *)&local_188,(PrefixExpType *)in_RSI);
        if (local_128._0_4_ == 2) {
          local_190 = local_188;
          local_188.number_ = 0.0;
        }
        else {
          if (local_128._0_4_ != 1) {
            pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException(pPVar15,"incomplete statement",t);
            __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
          }
          paVar11 = (anon_union_8_2_010d16d7_for_TokenDetail_0 *)operator_new(0x20);
          *paVar11 = local_80;
          paVar11[1].number_ = 0.0;
          paVar11[2].number_ = 0.0;
          paVar11[3].number_ = 0.0;
          std::
          vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
          ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                    ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                      *)(paVar11 + 1),
                     (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     &local_188);
          while( true ) {
            if ((in_RSI->look_ahead_).token_ == 0x11e) {
              luna::Lexer::GetToken(in_RSI->lexer_,detail);
            }
            if ((in_RSI->look_ahead_).token_ == 0x3d) break;
            if ((in_RSI->look_ahead_).token_ == 0x11e) {
              luna::Lexer::GetToken(in_RSI->lexer_,detail);
            }
            if ((in_RSI->look_ahead_).token_ != 0x2c) {
              pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
              luna::ParseException::ParseException(pPVar15,"expect \',\' to split var",detail);
LAB_001501ce:
              __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
            }
            NextToken(in_RSI);
            ParsePrefixExp((ParserImpl *)&local_158,(PrefixExpType *)in_RSI);
            aVar8 = local_158;
            aVar10 = local_188;
            local_158.number_ = 0.0;
            local_188 = aVar8;
            if (aVar10.str_ != (String *)0x0) {
              (*((aVar10.str_)->super_GCObject)._vptr_GCObject[1])();
            }
            if (local_158.str_ != (String *)0x0) {
              (*((local_158.str_)->super_GCObject)._vptr_GCObject[1])();
            }
            if (local_128._0_4_ != 1) {
              pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
              luna::ParseException::ParseException(pPVar15,"expect var here",t);
              goto LAB_001501ce;
            }
            std::
            vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
            ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                      ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                        *)(paVar11 + 1),
                       (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       &local_188);
          }
          NextToken(in_RSI);
          ParseExpList((ParserImpl *)&local_158);
          local_190.str_ = (String *)operator_new(0x28);
          aVar10 = local_158;
          local_158.number_ = 0.0;
          ((local_190.str_)->super_GCObject)._vptr_GCObject = local_88;
          ((local_190.str_)->super_GCObject).next_ = (GCObject *)paVar11;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
           &((local_190.str_)->super_GCObject).field_0x10 = aVar10;
          *(int *)&(local_190.str_)->field_1 = iVar1;
          *(undefined8 *)((long)&(local_190.str_)->field_1 + 8) = 0;
        }
        if (local_188.str_ != (String *)0x0) {
          (*((local_188.str_)->super_GCObject)._vptr_GCObject[1])();
        }
        break;
      case 0x107:
        NextToken(in_RSI);
        if ((in_RSI->current_).token_ != 0x107) {
          __assert_fail("current_.token_ == Token_For",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x1bb,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseForStatement()"
                       );
        }
        if ((in_RSI->look_ahead_).token_ == 0x11e) {
          luna::Lexer::GetToken(in_RSI->lexer_,detail);
        }
        if ((in_RSI->look_ahead_).token_ != 0x115) {
          pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar15,"expect \'id\' after \'for\'",detail);
          goto LAB_0015064d;
        }
        pTVar12 = LookAhead2(in_RSI);
        if (pTVar12->token_ == 0x3d) {
          paVar11 = &NextToken(in_RSI)->field_0;
          local_188 = *paVar11;
          aStack_180 = paVar11[1];
          local_178 = paVar11[2];
          aStack_170 = paVar11[3];
          if ((in_RSI->current_).token_ != 0x115) {
            __assert_fail("current_.token_ == Token_Id",
                          "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                          ,0x1c9,
                          "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseNumericForStatement()"
                         );
          }
          NextToken(in_RSI);
          if ((in_RSI->current_).token_ != 0x3d) {
            __assert_fail("current_.token_ == \'=\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                          ,0x1cc,
                          "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseNumericForStatement()"
                         );
          }
          local_f0 = (long *)0x0;
          local_158.number_ = 0.0;
          uStack_150 = 0;
          local_148 = 0;
          uStack_140 = 0x11e;
          op_01._28_4_ = uStack_13c;
          op_01.token_ = 0x11e;
          op_01.line_ = 0;
          op_01.column_ = 0;
          op_01.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
          op_01.module_ = (String *)0x0;
          ParseExp((ParserImpl *)&local_160,
                   (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                   op_01,(int)&local_f0);
          if (local_f0 != (long *)0x0) {
            (**(code **)(*local_f0 + 8))();
          }
          local_f0 = (long *)0x0;
          pTVar12 = NextToken(in_RSI);
          if (pTVar12->token_ != 0x2c) {
            pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException(pPVar15,"expect \',\' in numeric-for",t);
            __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
          }
          local_f8 = (String *)0x0;
          local_128.number_ = 0.0;
          uStack_120 = 0;
          local_118 = 0;
          uStack_110 = 0x11e;
          op_02._28_4_ = uStack_10c;
          op_02.token_ = 0x11e;
          op_02.line_ = 0;
          op_02.column_ = 0;
          op_02.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
          op_02.module_ = (String *)0x0;
          ParseExp((ParserImpl *)local_c8,
                   (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                   op_02,(int)&local_f8);
          if (local_f8 != (String *)0x0) {
            (*(local_f8->super_GCObject)._vptr_GCObject[1])();
          }
          local_f8 = (String *)0x0;
          if ((in_RSI->look_ahead_).token_ == 0x11e) {
            luna::Lexer::GetToken(in_RSI->lexer_,detail);
          }
          if ((in_RSI->look_ahead_).token_ == 0x2c) {
            NextToken(in_RSI);
            local_100.number_ = 0.0;
            local_e8.number_ = 0.0;
            uStack_e0 = 0;
            local_d8 = 0;
            uStack_d0 = 0x11e;
            op_03._28_4_ = uStack_cc;
            op_03.token_ = 0x11e;
            op_03.line_ = 0;
            op_03.column_ = 0;
            op_03.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
            op_03.module_ = (String *)0x0;
            ParseExp((ParserImpl *)&local_130,
                     (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                     op_03,(int)&local_100);
            aVar10 = local_130;
            local_130.number_ = 0.0;
            if (local_100.str_ != (String *)0x0) {
              (*((local_100.str_)->super_GCObject)._vptr_GCObject[1])();
            }
            local_100.number_ = 0.0;
          }
          else {
            aVar10.number_ = 0.0;
          }
          pTVar12 = NextToken(in_RSI);
          if (pTVar12->token_ != 0x102) {
            pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException
                      (pPVar15,"expect \'do\' to start numeric-for body",t);
            __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
          }
          ParseBlock((ParserImpl *)&local_130);
          pTVar12 = NextToken(in_RSI);
          if (pTVar12->token_ != 0x105) {
            pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException(pPVar15,"expect \'end\' to complete numeric-for",t)
            ;
            __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
          }
          local_190.str_ = (String *)operator_new(0x48);
          uVar6 = local_c8._0_8_;
          aVar9 = local_130;
          aVar8 = local_160;
          local_160.number_ = 0.0;
          local_c8._0_8_ = (Lexer *)0x0;
          local_130.number_ = 0.0;
          ((local_190.str_)->super_GCObject)._vptr_GCObject = local_a8;
          ((local_190.str_)->super_GCObject).next_ = (GCObject *)local_188;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
           &((local_190.str_)->super_GCObject).field_0x10 = aStack_180;
          ((local_190.str_)->field_1).str_ = (char *)local_178;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)((long)&(local_190.str_)->field_1 + 8) =
               aStack_170;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&(local_190.str_)->length_ = aVar8;
          (local_190.str_)->hash_ = uVar6;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)(local_190.str_ + 1) = aVar10;
          local_190.str_[1].super_GCObject.next_ = (GCObject *)aVar9;
        }
        else {
          if ((in_RSI->look_ahead_).token_ == 0x11e) {
            luna::Lexer::GetToken(in_RSI->lexer_,detail);
          }
          iVar1 = (in_RSI->look_ahead_).line_;
          ParseNameList((ParserImpl *)&local_188);
          pTVar12 = NextToken(in_RSI);
          if (pTVar12->token_ != 0x10a) {
            pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException(pPVar15,"expect \'in\' in generic-for",t);
            __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
          }
          ParseExpList((ParserImpl *)&local_158);
          pTVar12 = NextToken(in_RSI);
          if (pTVar12->token_ != 0x102) {
            pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException
                      (pPVar15,"expect \'do\' to start generic-for body",t);
            __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
          }
          ParseBlock((ParserImpl *)&local_128);
          pTVar12 = NextToken(in_RSI);
          if (pTVar12->token_ != 0x105) {
            pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException(pPVar15,"expect \'end\' to complete generic-for",t)
            ;
            __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
          }
          local_190.str_ = (String *)operator_new(0x28);
          aVar9 = local_128;
          aVar8 = local_158;
          aVar10 = local_188;
          local_188.number_ = 0.0;
          local_158.number_ = 0.0;
          local_128.number_ = 0.0;
          ((local_190.str_)->super_GCObject)._vptr_GCObject = (_func_int **)local_a0;
          ((local_190.str_)->super_GCObject).next_ = (GCObject *)aVar10;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
           &((local_190.str_)->super_GCObject).field_0x10 = aVar8;
          ((local_190.str_)->field_1).str_ = (char *)aVar9;
          *(int *)((long)&(local_190.str_)->field_1 + 8) = iVar1;
        }
        break;
      case 0x108:
        NextToken(in_RSI);
        if ((in_RSI->current_).token_ != 0x108) {
          __assert_fail("current_.token_ == Token_Function",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x195,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseFunctionStatement()"
                       );
        }
        pTVar12 = NextToken(in_RSI);
        if (pTVar12->token_ == 0x115) {
          pGVar13 = (GCObject *)operator_new(0x48);
          pGVar13->_vptr_GCObject = local_50;
          pGVar13->next_ = (GCObject *)0x0;
          *(undefined8 *)&pGVar13->field_0x10 = 0;
          pGVar13[1]._vptr_GCObject = (_func_int **)0x0;
          pGVar13[1].next_ = (GCObject *)0x0;
          *(undefined8 *)&pGVar13[1].field_0x10 = 0;
          pGVar13[2]._vptr_GCObject = (_func_int **)0x0;
          *(undefined4 *)&pGVar13[2].next_ = 0x11e;
          *(undefined4 *)&pGVar13[2].field_0x10 = 0;
          __position._M_current = *(TokenDetail **)&pGVar13->field_0x10;
          if (__position._M_current == (TokenDetail *)pGVar13[1]._vptr_GCObject) {
            std::vector<luna::TokenDetail,std::allocator<luna::TokenDetail>>::
            _M_realloc_insert<luna::TokenDetail_const&>
                      ((vector<luna::TokenDetail,std::allocator<luna::TokenDetail>> *)
                       &pGVar13->next_,__position,t);
            goto LAB_0014fde6;
          }
LAB_0014fb19:
          aVar10 = t->field_0;
          pSVar4 = (in_RSI->current_).module_;
          iVar1 = (in_RSI->current_).column_;
          iVar2 = (in_RSI->current_).token_;
          uVar7 = *(undefined4 *)&(in_RSI->current_).field_0x1c;
          (__position._M_current)->line_ = (in_RSI->current_).line_;
          (__position._M_current)->column_ = iVar1;
          (__position._M_current)->token_ = iVar2;
          *(undefined4 *)&(__position._M_current)->field_0x1c = uVar7;
          (__position._M_current)->field_0 = aVar10;
          (__position._M_current)->module_ = pSVar4;
          *(long *)&pGVar13->field_0x10 = *(long *)&pGVar13->field_0x10 + 0x20;
LAB_0014fde6:
          do {
            if ((in_RSI->look_ahead_).token_ == 0x11e) {
              luna::Lexer::GetToken(in_RSI->lexer_,detail);
            }
            iVar1 = (in_RSI->look_ahead_).token_;
            if (iVar1 != 0x2e) {
              if (iVar1 == 0x11e) {
                luna::Lexer::GetToken(in_RSI->lexer_,detail);
              }
              if ((in_RSI->look_ahead_).token_ == 0x3a) {
                NextToken(in_RSI);
                pTVar12 = NextToken(in_RSI);
                if (pTVar12->token_ != 0x115) {
                  pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
                  luna::ParseException::ParseException
                            (pPVar15,"unexpect token in function name after \':\'",t);
                  goto LAB_00150203;
                }
                aVar10 = t->field_0;
                pSVar4 = (in_RSI->current_).module_;
                uVar6 = *(undefined8 *)&(in_RSI->current_).column_;
                *(undefined8 *)&pGVar13[1].field_0x14 =
                     *(undefined8 *)((long)&(in_RSI->current_).module_ + 4);
                *(undefined8 *)((long)&pGVar13[2]._vptr_GCObject + 4) = uVar6;
                pGVar13[1].next_ = (GCObject *)aVar10;
                *(String **)&pGVar13[1].field_0x10 = pSVar4;
              }
              ParseFunctionBody((ParserImpl *)&local_188);
              local_190.str_ = (String *)operator_new(0x18);
              aVar10 = local_188;
              local_188.number_ = 0.0;
              ((local_190.str_)->super_GCObject)._vptr_GCObject = (_func_int **)local_78;
              ((local_190.str_)->super_GCObject).next_ = pGVar13;
              *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
               &((local_190.str_)->super_GCObject).field_0x10 = aVar10;
              goto LAB_00150133;
            }
            NextToken(in_RSI);
            pTVar12 = NextToken(in_RSI);
            if (pTVar12->token_ != 0x115) {
              pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
              luna::ParseException::ParseException
                        (pPVar15,"unexpect token in function name after \'.\'",t);
LAB_00150203:
              __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
            }
            __position._M_current = *(TokenDetail **)&pGVar13->field_0x10;
            if (__position._M_current != (TokenDetail *)pGVar13[1]._vptr_GCObject)
            goto LAB_0014fb19;
            std::vector<luna::TokenDetail,std::allocator<luna::TokenDetail>>::
            _M_realloc_insert<luna::TokenDetail_const&>
                      ((vector<luna::TokenDetail,std::allocator<luna::TokenDetail>> *)
                       &pGVar13->next_,__position,t);
          } while( true );
        }
        pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException(pPVar15,"unexpect token after \'function\'",t);
LAB_0015064d:
        __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      case 0x109:
        NextToken(in_RSI);
        if ((in_RSI->current_).token_ != 0x109) {
          __assert_fail("current_.token_ == Token_If",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x151,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseIfStatement()"
                       );
        }
        iVar1 = (in_RSI->current_).line_;
        local_128.number_ = 0.0;
        local_188.number_ = 0.0;
        aStack_180.number_ = 0.0;
        local_178.number_ = 0.0;
        aStack_170._0_4_ = 0x11e;
        op_04.line_ = 0;
        op_04.column_ = 0;
        op_04.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op_04.module_ = (String *)0x0;
        op_04._24_8_ = aStack_170.str_;
        ParseExp((ParserImpl *)&local_158,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                 op_04,(int)&local_128);
        if (local_128.str_ != (String *)0x0) {
          (*((local_128.str_)->super_GCObject)._vptr_GCObject[1])();
        }
        local_128.number_ = 0.0;
        pTVar12 = NextToken(in_RSI);
        if (pTVar12->token_ != 0x111) {
          pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar15,"expect \'then\' for if",t);
          __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        ParseBlock((ParserImpl *)&local_e8);
        if ((in_RSI->look_ahead_).token_ == 0x11e) {
          luna::Lexer::GetToken(in_RSI->lexer_,detail);
        }
        iVar2 = (in_RSI->look_ahead_).line_;
        ParseFalseBranchStatement((ParserImpl *)&local_160);
        local_190.str_ = (String *)operator_new(0x28);
        aVar9 = local_e8;
        aVar8 = local_158;
        aVar10 = local_160;
        local_158.number_ = 0.0;
        local_e8.number_ = 0.0;
        local_160.number_ = 0.0;
        ((local_190.str_)->super_GCObject)._vptr_GCObject = local_68;
        ((local_190.str_)->super_GCObject).next_ = (GCObject *)aVar8;
        *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_190.str_)->super_GCObject).field_0x10
             = aVar9;
        ((local_190.str_)->field_1).str_ = (char *)aVar10;
        *(int *)((long)&(local_190.str_)->field_1 + 8) = iVar1;
        *(int *)((long)&(local_190.str_)->field_1 + 0xc) = iVar2;
        break;
      case 0x10b:
        NextToken(in_RSI);
        if ((in_RSI->current_).token_ != 0x10b) {
          __assert_fail("current_.token_ == Token_Local",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x200,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseLocalStatement()"
                       );
        }
        if ((in_RSI->look_ahead_).token_ == 0x11e) {
          luna::Lexer::GetToken(in_RSI->lexer_,detail);
        }
        if ((in_RSI->look_ahead_).token_ == 0x108) {
          NextToken(in_RSI);
          if ((in_RSI->current_).token_ != 0x108) {
            __assert_fail("current_.token_ == Token_Function",
                          "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                          ,0x210,
                          "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseLocalFunction()"
                         );
          }
          pTVar12 = NextToken(in_RSI);
          if (pTVar12->token_ != 0x115) {
            pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException(pPVar15,"expect \'id\' after \'local function\'",t)
            ;
            goto LAB_0015064d;
          }
          local_188 = t->field_0;
          aStack_180 = (anon_union_8_2_010d16d7_for_TokenDetail_0)(in_RSI->current_).module_;
          local_178 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&(in_RSI->current_).line_;
          aStack_170 = *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&(in_RSI->current_).token_;
          ParseFunctionBody((ParserImpl *)&local_158);
          local_190.str_ = (String *)operator_new(0x30);
          aVar10 = local_158;
          local_158.number_ = 0.0;
          ((local_190.str_)->super_GCObject)._vptr_GCObject = (_func_int **)local_98;
          ((local_190.str_)->super_GCObject).next_ = (GCObject *)local_188;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
           &((local_190.str_)->super_GCObject).field_0x10 = aStack_180;
          ((local_190.str_)->field_1).str_ = (char *)local_178;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)((long)&(local_190.str_)->field_1 + 8) =
               aStack_170;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&(local_190.str_)->length_ = aVar10;
        }
        else {
          if ((in_RSI->look_ahead_).token_ == 0x11e) {
            luna::Lexer::GetToken(in_RSI->lexer_,detail);
          }
          if ((in_RSI->look_ahead_).token_ != 0x115) {
            pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
            luna::ParseException::ParseException(pPVar15,"unexpect token after \'local\'",detail);
            goto LAB_0015064d;
          }
          if ((in_RSI->look_ahead_).token_ == 0x11e) {
            luna::Lexer::GetToken(in_RSI->lexer_,detail);
          }
          iVar1 = (in_RSI->look_ahead_).line_;
          ParseNameList((ParserImpl *)&local_188);
          if ((in_RSI->look_ahead_).token_ == 0x11e) {
            luna::Lexer::GetToken(in_RSI->lexer_,detail);
          }
          if ((in_RSI->look_ahead_).token_ == 0x3d) {
            NextToken(in_RSI);
            ParseExpList((ParserImpl *)&local_158);
            aVar10 = local_158;
          }
          else {
            aVar10.number_ = 0.0;
          }
          local_190.str_ = (String *)operator_new(0x28);
          aVar8 = local_188;
          local_188.number_ = 0.0;
          ((local_190.str_)->super_GCObject)._vptr_GCObject = local_90;
          ((local_190.str_)->super_GCObject).next_ = (GCObject *)aVar8;
          *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)
           &((local_190.str_)->super_GCObject).field_0x10 = aVar10;
          *(int *)&(local_190.str_)->field_1 = iVar1;
          *(undefined8 *)((long)&(local_190.str_)->field_1 + 8) = 0;
        }
        break;
      case 0x10f:
        NextToken(in_RSI);
        if ((in_RSI->current_).token_ != 0x10f) {
          __assert_fail("current_.token_ == Token_Repeat",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x13f,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseRepeatStatement()"
                       );
        }
        ParseBlock((ParserImpl *)&local_158);
        pTVar12 = NextToken(in_RSI);
        if (pTVar12->token_ != 0x113) {
          pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar15,"expect \'until\' for repeat-statement",t);
          __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        iVar1 = (in_RSI->current_).line_;
        local_e8.number_ = 0.0;
        local_188.number_ = 0.0;
        aStack_180.number_ = 0.0;
        local_178.number_ = 0.0;
        aStack_170._0_4_ = 0x11e;
        op_00.line_ = 0;
        op_00.column_ = 0;
        op_00.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op_00.module_ = (String *)0x0;
        op_00._24_8_ = aStack_170.str_;
        ParseExp((ParserImpl *)&local_128,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,
                 op_00,(int)&local_e8);
        if (local_e8.str_ != (String *)0x0) {
          (*((local_e8.str_)->super_GCObject)._vptr_GCObject[1])();
        }
        local_e8.number_ = 0.0;
        local_190.str_ = (String *)operator_new(0x20);
        aVar8 = local_128;
        aVar10 = local_158;
        local_158.number_ = 0.0;
        local_128.number_ = 0.0;
        ((local_190.str_)->super_GCObject)._vptr_GCObject = local_60;
        ((local_190.str_)->super_GCObject).next_ = (GCObject *)aVar10;
        *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_190.str_)->super_GCObject).field_0x10
             = aVar8;
        *(int *)&(local_190.str_)->field_1 = iVar1;
        break;
      case 0x114:
        NextToken(in_RSI);
        if ((in_RSI->current_).token_ != 0x114) {
          __assert_fail("current_.token_ == Token_While",
                        "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                        ,0x128,
                        "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseWhileStatement()"
                       );
        }
        iVar1 = (in_RSI->current_).line_;
        local_128.number_ = 0.0;
        local_188.number_ = 0.0;
        aStack_180.number_ = 0.0;
        local_178.number_ = 0.0;
        aStack_170._0_4_ = 0x11e;
        op.line_ = 0;
        op.column_ = 0;
        op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
        op.module_ = (String *)0x0;
        op._24_8_ = aStack_170.str_;
        ParseExp((ParserImpl *)&local_158,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op,
                 (int)&local_128);
        if (local_128.str_ != (String *)0x0) {
          (*((local_128.str_)->super_GCObject)._vptr_GCObject[1])();
        }
        local_128.number_ = 0.0;
        pTVar12 = NextToken(in_RSI);
        if (pTVar12->token_ != 0x102) {
          pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar15,"expect \'do\' for while-statement",t);
          __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        ParseBlock((ParserImpl *)&local_e8);
        pTVar12 = NextToken(in_RSI);
        if (pTVar12->token_ != 0x105) {
          pPVar15 = (ParseException *)__cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(pPVar15,"expect \'end\' for while-statement",t);
          __cxa_throw(pPVar15,&luna::ParseException::typeinfo,luna::Exception::~Exception);
        }
        iVar2 = (in_RSI->current_).line_;
        local_190.str_ = (String *)operator_new(0x20);
        aVar8 = local_e8;
        aVar10 = local_158;
        local_158.number_ = 0.0;
        local_e8.number_ = 0.0;
        ((local_190.str_)->super_GCObject)._vptr_GCObject = local_70;
        ((local_190.str_)->super_GCObject).next_ = (GCObject *)aVar10;
        *(anon_union_8_2_010d16d7_for_TokenDetail_0 *)&((local_190.str_)->super_GCObject).field_0x10
             = aVar8;
        *(int *)&(local_190.str_)->field_1 = iVar1;
        *(int *)((long)&(local_190.str_)->field_1 + 4) = iVar2;
        break;
      default:
        if (iVar1 != 0x3b) goto switchD_0014f34e_caseD_103;
        NextToken(in_RSI);
        local_190.number_ = 0.0;
      }
LAB_00150133:
      aVar10 = local_190;
      if (local_190.str_ != (String *)0x0) {
        std::
        vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
        ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
                  (local_38,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                            &local_190);
        aVar10 = local_190;
      }
    }
    if (aVar10.str_ != (String *)0x0) {
      (*((aVar10.str_)->super_GCObject)._vptr_GCObject[1])();
    }
  } while( true );
}

Assistant:

std::unique_ptr<SyntaxTree> ParseBlock()
        {
            std::unique_ptr<Block> block(new Block);

            bool has_return = false;
            while (LookAhead().token_ != Token_EOF &&
                   LookAhead().token_ != Token_End &&
                   LookAhead().token_ != Token_Until &&
                   LookAhead().token_ != Token_Elseif &&
                   LookAhead().token_ != Token_Else)
            {
                if (has_return)
                    throw ParseException("unexpect statement after return statement", look_ahead_);

                if (LookAhead().token_ == Token_Return)
                {
                    block->return_stmt_ = ParseReturnStatement();
                    has_return = true;
                }
                else
                {
                    std::unique_ptr<SyntaxTree> statement = ParseStatement();
                    if (statement)
                        block->statements_.push_back(std::move(statement));
                }
            }

            return std::move(block);
        }